

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded.cpp
# Opt level: O3

bool __thiscall clickhouse::CodedInputStream::Skip(CodedInputStream *this,size_t count)

{
  int iVar1;
  undefined4 extraout_var;
  size_t sVar2;
  void *ptr;
  undefined1 local_20 [8];
  
  do {
    sVar2 = count;
    if (sVar2 == 0) break;
    iVar1 = (*(this->input_->super_InputStream)._vptr_InputStream[3])(this->input_,local_20,sVar2);
    count = sVar2 - CONCAT44(extraout_var,iVar1);
  } while (CONCAT44(extraout_var,iVar1) != 0);
  return sVar2 == 0;
}

Assistant:

bool CodedInputStream::Skip(size_t count) {
    while (count > 0) {
        const void* ptr;
        size_t len = input_->Next(&ptr, count);

        if (len == 0) {
            return false;
        }

        count -= len;
    }

    return true;
}